

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O2

void testing::internal::XmlUnitTestResultPrinter::OutputXmlTestInfo
               (ostream *stream,char *test_case_name,TestInfo *test_info)

{
  TestInfoImpl *pTVar1;
  ostream *poVar2;
  TestPartResult *pTVar3;
  TimeInMillis ms;
  int i;
  int i_00;
  char *pcVar4;
  int iVar5;
  String message;
  undefined1 local_88 [16];
  string local_78;
  TestResult *local_58;
  undefined1 local_50 [32];
  
  pTVar1 = test_info->impl_;
  poVar2 = std::operator<<(stream,"    <testcase name=\"");
  EscapeXmlAttribute((XmlUnitTestResultPrinter *)local_88,(test_info->impl_->name_).c_str_);
  poVar2 = std::operator<<(poVar2,(char *)local_88._0_8_);
  poVar2 = std::operator<<(poVar2,"\" status=\"");
  pcVar4 = "notrun";
  if (test_info->impl_->should_run_ != false) {
    pcVar4 = "run";
  }
  poVar2 = std::operator<<(poVar2,pcVar4);
  poVar2 = std::operator<<(poVar2,"\" time=\"");
  FormatTimeInMillisAsSeconds_abi_cxx11_
            ((string *)(local_88 + 0x10),(internal *)(pTVar1->result_).elapsed_time_,ms);
  poVar2 = std::operator<<(poVar2,(string *)(local_88 + 0x10));
  poVar2 = std::operator<<(poVar2,"\" classname=\"");
  EscapeXmlAttribute((XmlUnitTestResultPrinter *)(local_50 + 0x10),test_case_name);
  poVar2 = std::operator<<(poVar2,(char *)local_50._16_8_);
  poVar2 = std::operator<<(poVar2,"\"");
  local_58 = &pTVar1->result_;
  TestPropertiesAsXmlAttributes((XmlUnitTestResultPrinter *)local_50,local_58);
  std::operator<<(poVar2,(char *)local_50._0_8_);
  String::~String((String *)local_50);
  String::~String((String *)(local_50 + 0x10));
  std::__cxx11::string::~string((string *)(local_88 + 0x10));
  String::~String((String *)local_88);
  iVar5 = 0;
  for (i_00 = 0;
      i_00 < (int)((ulong)((long)(pTVar1->result_).test_part_results_.
                                 super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(pTVar1->result_).test_part_results_.
                                super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 6); i_00 = i_00 + 1) {
    pTVar3 = TestResult::GetTestPartResult(local_58,i_00);
    if (pTVar3->type_ != kSuccess) {
      if (iVar5 == 0) {
        std::operator<<(stream,">\n");
      }
      poVar2 = std::operator<<(stream,"      <failure message=\"");
      EscapeXmlAttribute((XmlUnitTestResultPrinter *)(local_88 + 0x10),(pTVar3->summary_).c_str_);
      poVar2 = std::operator<<(poVar2,local_78._M_dataplus._M_p);
      std::operator<<(poVar2,"\" type=\"\">");
      String::~String((String *)(local_88 + 0x10));
      String::Format((char *)local_88,"%s:%d\n%s",(pTVar3->file_name_).c_str_,
                     (ulong)(uint)pTVar3->line_number_,(pTVar3->message_).c_str_);
      RemoveInvalidXmlCharacters
                ((XmlUnitTestResultPrinter *)(local_88 + 0x10),(char *)local_88._0_8_);
      String::~String((String *)local_88);
      OutputXmlCDataSection(stream,local_78._M_dataplus._M_p);
      std::operator<<(stream,"</failure>\n");
      iVar5 = iVar5 + 1;
      String::~String((String *)(local_88 + 0x10));
    }
  }
  pcVar4 = "    </testcase>\n";
  if (iVar5 == 0) {
    pcVar4 = " />\n";
  }
  std::operator<<(stream,pcVar4);
  return;
}

Assistant:

void XmlUnitTestResultPrinter::OutputXmlTestInfo(::std::ostream* stream,
                                                 const char* test_case_name,
                                                 const TestInfo& test_info) {
  const TestResult& result = *test_info.result();
  *stream << "    <testcase name=\""
          << EscapeXmlAttribute(test_info.name()).c_str()
          << "\" status=\""
          << (test_info.should_run() ? "run" : "notrun")
          << "\" time=\""
          << FormatTimeInMillisAsSeconds(result.elapsed_time())
          << "\" classname=\"" << EscapeXmlAttribute(test_case_name).c_str()
          << "\"" << TestPropertiesAsXmlAttributes(result).c_str();

  int failures = 0;
  for (int i = 0; i < result.total_part_count(); ++i) {
    const TestPartResult& part = result.GetTestPartResult(i);
    if (part.failed()) {
      if (++failures == 1)
        *stream << ">\n";
      *stream << "      <failure message=\""
              << EscapeXmlAttribute(part.summary()).c_str()
              << "\" type=\"\">";
      const String message = RemoveInvalidXmlCharacters(String::Format(
          "%s:%d\n%s",
          part.file_name(), part.line_number(),
          part.message()).c_str());
      OutputXmlCDataSection(stream, message.c_str());
      *stream << "</failure>\n";
    }
  }

  if (failures == 0)
    *stream << " />\n";
  else
    *stream << "    </testcase>\n";
}